

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check.c
# Opt level: O1

lzma_bool lzma_check_is_supported(lzma_check type)

{
  if (0xf < type) {
    return '\0';
  }
  return "\x01\x01"[type];
}

Assistant:

extern LZMA_API(lzma_bool)
lzma_check_is_supported(lzma_check type)
{
	static const lzma_bool available_checks[LZMA_CHECK_ID_MAX + 1] = {
		true,   // LZMA_CHECK_NONE

#ifdef HAVE_CHECK_CRC32
		true,
#else
		false,
#endif

		false,  // Reserved
		false,  // Reserved

#ifdef HAVE_CHECK_CRC64
		true,
#else
		false,
#endif

		false,  // Reserved
		false,  // Reserved
		false,  // Reserved
		false,  // Reserved
		false,  // Reserved

#ifdef HAVE_CHECK_SHA256
		true,
#else
		false,
#endif

		false,  // Reserved
		false,  // Reserved
		false,  // Reserved
		false,  // Reserved
		false,  // Reserved
	};

	if ((unsigned int)(type) > LZMA_CHECK_ID_MAX)
		return false;

	return available_checks[(unsigned int)(type)];
}